

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O2

void __thiscall
compress_tests::compress_script_to_ckey_id::test_method(compress_script_to_ckey_id *this)

{
  long lVar1;
  size_type sVar2;
  CScript *pCVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  undefined8 uVar4;
  undefined8 uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var7;
  bool *pbVar8;
  CKeyID *pCVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined4 local_1b4;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  bool done;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  CKey key;
  CompressedScript out;
  CKeyID local_b4;
  CScript script;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key,0));
  CKey::GetPubKey(&pubkey,&key);
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  pCVar3 = CScript::operator<<((CScript *)&out,OP_DUP);
  pCVar3 = CScript::operator<<(pCVar3,OP_HASH160);
  CPubKey::GetID(&local_b4,&pubkey);
  ToByteVector<CKeyID>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_170,&local_b4);
  pCVar3 = CScript::operator<<(pCVar3,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &local_170);
  pCVar3 = CScript::operator<<(pCVar3,OP_EQUALVERIFY);
  other = &CScript::operator<<(pCVar3,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_170);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&out);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x49;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011480b0;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  out._union._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  sVar2 = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    sVar2 = script.super_CScriptBase._size;
  }
  local_120 = "";
  p_Var7 = &local_170;
  local_170._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_170._M_impl.super__Vector_impl_data._M_start._4_4_,sVar2);
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\x19';
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&out,&local_128,0x49,1,2,p_Var7,"script.size()",&local_b4,"25U");
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4d;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = (iterator)p_Var7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  local_170._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_170._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_170._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst
  ;
  local_158 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_178 = "";
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\x01';
  pvVar6 = (iterator)0x2;
  pbVar8 = &done;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_170,&local_180,0x4d,1,2,pbVar8,"done",&local_b4,"true");
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000050;
  file_01.m_begin = (iterator)&local_190;
  msg_01.m_end = pbVar8;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a0,
             msg_01);
  local_170._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_170._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_170._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst
  ;
  local_158 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1a8 = "";
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = out._size - 0x22;
  if (out._size < 0x22) {
    local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = out._size;
  }
  local_1b4 = 0x15;
  pvVar6 = (iterator)0x2;
  pCVar9 = &local_b4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&local_170,&local_1b0,0x50,1,2,&local_b4,"out.size()",&local_1b4,"21U");
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x51;
  file_02.m_begin = (iterator)&local_1c8;
  msg_02.m_end = (iterator)pCVar9;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d8,
             msg_02);
  local_170._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_170._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_170._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst
  ;
  local_158 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1e0 = "";
  uVar5 = &out;
  if (0x21 < out._size) {
    uVar5 = out._union.indirect_contents.indirect;
  }
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_170,&local_1e8,0x51,1,2,uVar5,"out[0]",&local_b4,"0x00");
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x52;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = (iterator)uVar5;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  local_170._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_170._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_170._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst
  ;
  local_158 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_210 = "";
  uVar5 = out._union.indirect_contents.indirect;
  if (out._size < 0x22) {
    uVar5 = &out;
  }
  uVar4 = &script;
  if (0x1c < script.super_CScriptBase._size) {
    uVar4 = script.super_CScriptBase._union.indirect_contents.indirect;
  }
  local_b4.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ =
       memcmp((void *)((long)&((CompressedScript *)uVar5)->_union + 1),
              (void *)((long)&(((CScript *)uVar4)->super_CScriptBase)._union + 3),0x14);
  local_1b4 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_170,&local_218,0x52,1,2,&local_b4,
             "memcmp(out.data() + 1, script.data() + 3, 20)",&local_1b4,"0");
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(&out);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_script_to_ckey_id)
{
    // case CKeyID
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    CScript script = CScript() << OP_DUP << OP_HASH160 << ToByteVector(pubkey.GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(script.size(), 25U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, true);

    // Check compressed script
    BOOST_CHECK_EQUAL(out.size(), 21U);
    BOOST_CHECK_EQUAL(out[0], 0x00);
    BOOST_CHECK_EQUAL(memcmp(out.data() + 1, script.data() + 3, 20), 0); // compare the 20 relevant chars of the CKeyId in the script
}